

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O3

QSize QtMWidgets::qSmartMaxSize(QWidget *w,Alignment align)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  QSize QVar4;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_44;
  QSize local_40;
  QSize local_38;
  QSize local_30;
  
  uVar1 = (**(code **)(*(long *)w + 0x70))();
  uVar2 = (**(code **)(*(long *)w + 0x78))(w);
  uVar3 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar3 = uVar1;
  }
  if ((int)(uVar2 >> 0x20) < (int)(uVar1 >> 0x20)) {
    uVar2 = uVar1;
  }
  local_30 = (QSize)(uVar3 & 0xffffffff | uVar2 & 0xffffffff00000000);
  local_38 = (QSize)QWidget::minimumSize();
  local_40 = (QSize)QWidget::maximumSize();
  local_44.data = QWidget::sizePolicy();
  QVar4 = qSmartMaxSize(&local_30,&local_38,&local_40,(QSizePolicy *)&local_44.bits,align);
  return QVar4;
}

Assistant:

QSize qSmartMaxSize( const QWidget * w, Qt::Alignment align )
{
	return qSmartMaxSize( w->sizeHint().expandedTo( w->minimumSizeHint() ),
		w->minimumSize(), w->maximumSize(),
		w->sizePolicy(), align );
}